

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O0

bool __thiscall glslang::HlslGrammar::acceptAnnotations(HlslGrammar *this,TQualifier *param_1)

{
  bool bVar1;
  TIntermNode *local_28;
  TIntermNode *node;
  TQualifier *param_1_local;
  HlslGrammar *this_local;
  
  node = (TIntermNode *)param_1;
  param_1_local = (TQualifier *)this;
  bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftAngle);
  if (bVar1) {
    HlslParseContext::nestAnnotations(this->parseContext);
    do {
      do {
        bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokSemicolon);
      } while (bVar1);
      bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightAngle);
      if (bVar1) {
        HlslParseContext::unnestAnnotations(this->parseContext);
        return true;
      }
      local_28 = (TIntermNode *)0x0;
      bVar1 = acceptDeclaration(this,&local_28);
    } while (bVar1);
    expected(this,"declaration in annotation");
  }
  return false;
}

Assistant:

bool HlslGrammar::acceptAnnotations(TQualifier&)
{
    if (! acceptTokenClass(EHTokLeftAngle))
        return false;

    // note that we are nesting a name space
    parseContext.nestAnnotations();

    // declaration SEMI_COLON ... declaration SEMICOLON RIGHT_ANGLE
    do {
        // eat any extra SEMI_COLON; don't know if the grammar calls for this or not
        while (acceptTokenClass(EHTokSemicolon))
            ;

        if (acceptTokenClass(EHTokRightAngle))
            break;

        // declaration
        TIntermNode* node = nullptr;
        if (! acceptDeclaration(node)) {
            expected("declaration in annotation");
            return false;
        }
    } while (true);

    parseContext.unnestAnnotations();
    return true;
}